

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

Col_Word Col_NewRope(Col_StringFormat format,void *data,size_t byteLength)

{
  uint uVar1;
  ulong __n;
  Col_Word CVar2;
  ulong uVar3;
  Cell *pacVar4;
  Col_Word right;
  Col_Char4 *string;
  uint uVar5;
  char *__dest;
  short sVar6;
  Col_Char2 *pCVar7;
  size_t byteLength_00;
  undefined8 local_30;
  
  if (byteLength == 0) {
    return 0xc;
  }
  if ((format & 0x10) != 0) {
    if (0xfda < byteLength) {
      pCVar7 = (Col_Char2 *)
               (((byteLength / (format & (COL_UCS4|COL_UCS2|COL_UCS1)) >> 1) + 1) *
                (ulong)(format & (COL_UCS4|COL_UCS2|COL_UCS1)) + (long)data);
      if (format == COL_UTF16) {
        pCVar7 = Col_Utf16Prev(pCVar7);
      }
      else if (format == COL_UTF8) {
        pCVar7 = (Col_Char2 *)Col_Utf8Prev((Col_Char1 *)pCVar7);
      }
      byteLength_00 = (long)pCVar7 - (long)data;
      goto LAB_0010817f;
    }
    sVar6 = 0;
    pCVar7 = (Col_Char2 *)data;
    while (pCVar7 < (Col_Char2 *)((long)data + byteLength)) {
      if (format == COL_UTF16) {
        pCVar7 = Col_Utf16Next(pCVar7);
      }
      else if (format == COL_UTF8) {
        pCVar7 = (Col_Char2 *)Col_Utf8Next((Col_Char1 *)pCVar7);
      }
      sVar6 = sVar6 + 1;
    }
    pacVar4 = AllocCells(byteLength + 0x25 >> 5);
    (*pacVar4)[0] = '\n';
    (*pacVar4)[1] = (char)format;
    *(short *)(*pacVar4 + 2) = sVar6;
    *(short *)(*pacVar4 + 4) = (short)byteLength;
    __dest = *pacVar4 + 6;
    goto LAB_0010815d;
  }
  __n = byteLength / (format & (COL_UCS4|COL_UCS2|COL_UCS1));
  if (__n == 1) {
    if (format == 0x24) {
      CVar2 = Col_NewCharWord(*data);
      return CVar2;
    }
    if (format == COL_UCS2) {
      return (ulong)*data << 8 | 0x44;
    }
    if (format == COL_UCS4) {
      return (ulong)*data << 8 | 0x84;
    }
    if (format == COL_UCS1) {
      return (ulong)*data << 8 | 0x24;
    }
  }
  else {
    if (__n < 8) {
      if (format != 0x24) {
        if (format == COL_UCS1) {
          local_30 = __n << 5 | 0xc;
          memcpy((void *)((long)&local_30 + 1),data,__n);
          return local_30;
        }
        goto LAB_0010813d;
      }
      local_30 = __n << 5 | 0xc;
      for (uVar3 = 0; (uVar3 < __n && (uVar5 = *(uint *)((long)data + uVar3 * 4), uVar5 < 0x100));
          uVar3 = uVar3 + 1) {
        *(char *)((long)&local_30 + uVar3 + 1) = (char)uVar5;
      }
      if (__n == uVar3) {
        return local_30;
      }
    }
    if (0xffff < __n) {
      byteLength_00 = (__n >> 1) * (ulong)(format & (COL_UCS4|COL_UCS2|COL_UCS1));
LAB_0010817f:
      CVar2 = Col_NewRope(format,data,byteLength_00);
      right = Col_NewRope(format,(void *)((long)data + byteLength_00),byteLength - byteLength_00);
      CVar2 = Col_ConcatRopes(CVar2,right);
      return CVar2;
    }
    if (format == 0x24) {
      uVar5 = 1;
      for (uVar3 = 0; uVar3 < __n; uVar3 = uVar3 + 1) {
        uVar1 = *(uint *)((long)data + uVar3 * 4);
        if (0xffff < uVar1) {
          uVar5 = 4;
          break;
        }
        if (0xff < uVar1) {
          uVar5 = 2;
        }
      }
      byteLength = uVar5 * __n;
      pacVar4 = AllocCells(byteLength + 0x23 >> 5);
      (*pacVar4)[0] = '\x06';
      (*pacVar4)[1] = (char)uVar5;
      *(short *)(*pacVar4 + 2) = (short)__n;
      if (uVar5 != 4) {
        if (uVar5 == 2) {
          for (uVar3 = 0; uVar3 < __n; uVar3 = uVar3 + 1) {
            *(undefined2 *)(*pacVar4 + uVar3 * 2 + 4) = *(undefined2 *)((long)data + uVar3 * 4);
          }
          return (Col_Word)pacVar4;
        }
        if (uVar5 != 1) {
          return (Col_Word)pacVar4;
        }
        for (uVar3 = 0; uVar3 < __n; uVar3 = uVar3 + 1) {
          (*pacVar4)[uVar3 + 4] = *(char *)((long)data + uVar3 * 4);
        }
        return (Col_Word)pacVar4;
      }
      __dest = *pacVar4 + 4;
      goto LAB_0010815d;
    }
  }
LAB_0010813d:
  pacVar4 = AllocCells(byteLength + 0x23 >> 5);
  (*pacVar4)[0] = '\x06';
  (*pacVar4)[1] = (char)format;
  *(short *)(*pacVar4 + 2) = (short)__n;
  __dest = *pacVar4 + 4;
LAB_0010815d:
  memcpy(__dest,data,byteLength);
  return (Col_Word)pacVar4;
}

Assistant:

Col_Word
Col_NewRope(
    Col_StringFormat format,    /*!< Format of data in buffer. if #COL_UCS,
                                     data is provided as with #COL_UCS4 but
                                     will use #COL_UCS1 or #COL_UCS2 if data
                                     fits. */
    const void *data,           /*!< Buffer containing flat data. */
    size_t byteLength)          /*!< Length of data in bytes. */
{
    Col_Word rope;
    size_t length;
    size_t half=0;              /* Index of the split point. */

    /*
     * Quick cases.
     */

    if (byteLength == 0) {
        /* Empty string. */
        return WORD_SMALLSTR_EMPTY;
    }

    if (FORMAT_UTF(format)) {
        /*
         * Variable-width UTF-8/16 string.
         */

        const char *source = (const char *) data, *p;
        size_t codeUnits = byteLength / CHAR_WIDTH(format);
        if (byteLength <= UTFSTR_MAX_BYTELENGTH) {
            /*
             * String fits into one multi-cell leaf rope. We know the byte
             * length, now get the char length.
             */

            length = 0;
            for (p = source; p < source+byteLength; length++) {
                switch (format) {
                case COL_UTF8:  p = (const char *) Col_Utf8Next ((const Col_Char1 *) p); break;
                case COL_UTF16: p = (const char *) Col_Utf16Next((const Col_Char2 *) p); break;
                }
            }
            rope = (Col_Word) AllocCells(UTFSTR_SIZE(byteLength));
            WORD_UTFSTR_INIT(rope, format, length, byteLength);
            memcpy((void *) WORD_UTFSTR_DATA(rope), data, byteLength);
            return rope;
        }

        /*
         * Split data in half at char boundary.
         */

        p = source + (codeUnits/2 + 1) * CHAR_WIDTH(format);
        switch (format) {
        case COL_UTF8:  p = (const char *) Col_Utf8Prev ((const Col_Char1 *) p); break;
        case COL_UTF16: p = (const char *) Col_Utf16Prev((const Col_Char2 *) p); break;
        }
        half = p-source;
    } else {
        /*
         * Fixed-width UCS string.
         */

        length = byteLength / CHAR_WIDTH(format);
        if (length == 1) {
            /*
             * Single char.
             */

            switch (format) {
            case COL_UCS1: return WORD_CHAR_NEW(*(const Col_Char1 *) data, format);
            case COL_UCS2: return WORD_CHAR_NEW(*(const Col_Char2 *) data, format);
            case COL_UCS4: return WORD_CHAR_NEW(*(const Col_Char4 *) data, format);
            case COL_UCS: return Col_NewCharWord(*(const Col_Char4 *) data);
            }
        } else if (length <= SMALLSTR_MAX_LENGTH) {
            switch (format) {
            case COL_UCS1:
                /*
                 * Immediate string.
                 */

                WORD_SMALLSTR_SET_LENGTH(rope, length);
                memcpy(WORD_SMALLSTR_DATA(rope), data, length);
                return rope;

            case COL_UCS: {
                /*
                 * Use immediate string if possible.
                 */

                const Col_Char4 * string = (const Col_Char4 *) data;
                size_t i;
                WORD_SMALLSTR_SET_LENGTH(rope, length);
                for (i = 0; i < length; i++) {
                    if (string[i] > COL_CHAR1_MAX) break;
                    WORD_SMALLSTR_DATA(rope)[i] = (Col_Char1) string[i];
                }
                if (i == length) {
                    return rope;
                }
                break;
                }
            }
        }
        if (length <= UCSSTR_MAX_LENGTH) {
            /*
             * String fits into one multi-cell leaf rope.
             */

            if (format == COL_UCS) {
                /*
                 * Adaptive format.
                 */

                const Col_Char4 * string = (const Col_Char4 *) data;
                size_t i;
                format = COL_UCS1;
                for (i = 0; i < length; i++) {
                    if (string[i] > COL_CHAR2_MAX) {
                        format = COL_UCS4;
                        break;
                    } else if (string[i] > COL_CHAR1_MAX) {
                        format = COL_UCS2;
                    }
                }
                byteLength = length * CHAR_WIDTH(format);
                rope = (Col_Word) AllocCells(UCSSTR_SIZE(byteLength));
                WORD_UCSSTR_INIT(rope, format, length);
                switch (format) {
                case COL_UCS1: {
                    Col_Char1 * target
                            = (Col_Char1 *) WORD_UCSSTR_DATA(rope);
                    for (i = 0; i < length; i++) {
                        target[i] = string[i];
                    }
                    break;
                    }

                case COL_UCS2: {
                    Col_Char2 * target
                            = (Col_Char2 *) WORD_UCSSTR_DATA(rope);
                    for (i = 0; i < length; i++) {
                        target[i] = string[i];
                    }
                    break;
                    }

                case COL_UCS4:
                    memcpy((void *) WORD_UCSSTR_DATA(rope), data,
                            byteLength);
                    break;
                }
            } else {
                /*
                 * Fixed format.
                 */

                rope = (Col_Word) AllocCells(UCSSTR_SIZE(byteLength));
                WORD_UCSSTR_INIT(rope, format, length);
                memcpy((void *) WORD_UCSSTR_DATA(rope), data, byteLength);
            }
            return rope;
        }

        /*
         * Split data in half at char boundary.
         */

        half = (length/2) * CHAR_WIDTH(format);
    }

    /*
     * The rope is built by concatenating the two halves of the string. This
     * recursive halving ensures that the resulting binary tree is properly
     * balanced.
     */

    return Col_ConcatRopes(Col_NewRope(format, data, half),
            Col_NewRope(format, (const char *) data+half, byteLength-half));
}